

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::TraverseSchema::checkFixedFacet
          (TraverseSchema *this,DOMElement *elem,XMLCh *facetName,DatatypeValidator *baseDV,
          uint *flags)

{
  short *psVar1;
  short *psVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  short *psVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  short sVar10;
  long *plVar5;
  
  iVar4 = (*(elem->super_DOMNode)._vptr_DOMNode[0x2a])(elem,&SchemaSymbols::fgATT_FIXED);
  plVar5 = (long *)CONCAT44(extraout_var,iVar4);
  if (plVar5 == (long *)0x0) {
    return;
  }
  psVar6 = (short *)(**(code **)(*plVar5 + 0x150))(plVar5);
  if (psVar6 == (short *)0x0) {
    return;
  }
  sVar10 = *psVar6;
  if (sVar10 == 0) {
    return;
  }
  if (psVar6 != &SchemaSymbols::fgATTVAL_TRUE) {
    lVar7 = 0;
    do {
      lVar9 = lVar7;
      if (sVar10 != *(short *)((long)&SchemaSymbols::fgATTVAL_TRUE + lVar9)) {
        if (psVar6 == &fgValueOne) goto LAB_0032ff6d;
        goto LAB_0032ff3e;
      }
      sVar10 = *(short *)((long)psVar6 + lVar9 + 2);
      lVar7 = lVar9 + 2;
    } while (sVar10 != 0);
    if ((psVar6 != &fgValueOne) && (*(short *)((long)&DAT_003688bc + lVar9) != 0)) {
LAB_0032ff3e:
      lVar7 = 0;
      while (psVar2 = (short *)((long)psVar6 + lVar7), *psVar2 != 0) {
        psVar1 = (short *)((long)&fgValueOne + lVar7);
        lVar7 = lVar7 + 2;
        if (*psVar2 != *psVar1) {
          return;
        }
      }
      if (*(short *)((long)&fgValueOne + lVar7) != 0) {
        return;
      }
    }
  }
LAB_0032ff6d:
  if (facetName == L"length") {
LAB_0032ffb4:
    *(byte *)flags = (byte)*flags | 1;
LAB_0032ffb7:
    uVar8 = 2;
    if (facetName == L"minLength") goto LAB_00330180;
    if (facetName != (XMLCh *)0x0) {
      lVar7 = 0;
      do {
        psVar6 = (short *)((long)&SchemaSymbols::fgELT_MINLENGTH + lVar7);
        if (*psVar6 == 0) {
          if (*(short *)((long)facetName + lVar7) == 0) goto LAB_00330180;
          break;
        }
        psVar2 = (short *)((long)facetName + lVar7);
        lVar7 = lVar7 + 2;
      } while (*psVar6 == *psVar2);
      uVar8 = 4;
      if (facetName == L"maxLength") goto LAB_00330180;
      lVar7 = 0;
      do {
        psVar6 = (short *)((long)&SchemaSymbols::fgELT_MAXLENGTH + lVar7);
        if (*psVar6 == 0) {
          if (*(short *)((long)facetName + lVar7) == 0) goto LAB_00330180;
          break;
        }
        psVar2 = (short *)((long)facetName + lVar7);
        lVar7 = lVar7 + 2;
      } while (*psVar6 == *psVar2);
      uVar8 = 0x40;
      if (facetName == L"maxExclusive") goto LAB_00330180;
      lVar7 = 0;
      do {
        psVar6 = (short *)((long)&SchemaSymbols::fgELT_MAXEXCLUSIVE + lVar7);
        if (*psVar6 == 0) {
          if (*(short *)((long)facetName + lVar7) == 0) goto LAB_00330180;
          break;
        }
        psVar2 = (short *)((long)facetName + lVar7);
        lVar7 = lVar7 + 2;
      } while (*psVar6 == *psVar2);
      uVar8 = 0x20;
      if (facetName == L"maxInclusive") goto LAB_00330180;
      lVar7 = 0;
      do {
        psVar6 = (short *)((long)&SchemaSymbols::fgELT_MAXINCLUSIVE + lVar7);
        if (*psVar6 == 0) {
          if (*(short *)((long)facetName + lVar7) == 0) goto LAB_00330180;
          break;
        }
        psVar2 = (short *)((long)facetName + lVar7);
        lVar7 = lVar7 + 2;
      } while (*psVar6 == *psVar2);
    }
  }
  else if (facetName != (XMLCh *)0x0) {
    lVar7 = 0;
    do {
      psVar6 = (short *)((long)&SchemaSymbols::fgELT_LENGTH + lVar7);
      if (*psVar6 == 0) {
        if (*(short *)((long)facetName + lVar7) == 0) goto LAB_0032ffb4;
        break;
      }
      psVar2 = (short *)((long)facetName + lVar7);
      lVar7 = lVar7 + 2;
    } while (*psVar6 == *psVar2);
    goto LAB_0032ffb7;
  }
  bVar3 = XMLString::equals(L"minExclusive",facetName);
  uVar8 = 0x100;
  if (!bVar3) {
    bVar3 = XMLString::equals(L"minInclusive",facetName);
    uVar8 = 0x80;
    if (!bVar3) {
      bVar3 = XMLString::equals(L"totalDigits",facetName);
      uVar8 = 0x200;
      if (!bVar3) {
        bVar3 = XMLString::equals(L"fractionDigits",facetName);
        uVar8 = 0x400;
        if (!bVar3) {
          bVar3 = XMLString::equals(L"whiteSpace",facetName);
          if (!bVar3) {
            return;
          }
          if (baseDV->fType != String) {
            return;
          }
          uVar8 = 0x4000;
        }
      }
    }
  }
LAB_00330180:
  *flags = *flags | uVar8;
  return;
}

Assistant:

void TraverseSchema::checkFixedFacet(const DOMElement* const elem,
                                     const XMLCh* const facetName,
                                     const DatatypeValidator* const baseDV,
                                     unsigned int& flags)
{
    const XMLCh* fixedFacet = getElementAttValue(elem, SchemaSymbols::fgATT_FIXED);

    if ((fixedFacet && *fixedFacet) &&
        (XMLString::equals(fixedFacet, SchemaSymbols::fgATTVAL_TRUE)
         || XMLString::equals(fixedFacet, fgValueOne))) {

        if (XMLString::equals(SchemaSymbols::fgELT_LENGTH, facetName)) {
            flags |= DatatypeValidator::FACET_LENGTH;
        }
        if (XMLString::equals(SchemaSymbols::fgELT_MINLENGTH, facetName)) {
            flags |= DatatypeValidator::FACET_MINLENGTH;
        }
        else if (XMLString::equals(SchemaSymbols::fgELT_MAXLENGTH, facetName)) {
            flags |= DatatypeValidator::FACET_MAXLENGTH;
        }
        else if (XMLString::equals(SchemaSymbols::fgELT_MAXEXCLUSIVE, facetName)) {
            flags |= DatatypeValidator::FACET_MAXEXCLUSIVE;
        }
        else if (XMLString::equals(SchemaSymbols::fgELT_MAXINCLUSIVE, facetName)) {
            flags |= DatatypeValidator::FACET_MAXINCLUSIVE;
        }
        else if (XMLString::equals(SchemaSymbols::fgELT_MINEXCLUSIVE, facetName)) {
            flags |= DatatypeValidator::FACET_MINEXCLUSIVE;
        }
        else if (XMLString::equals(SchemaSymbols::fgELT_MININCLUSIVE, facetName)) {
            flags |= DatatypeValidator::FACET_MININCLUSIVE;
        }
        else if (XMLString::equals(SchemaSymbols::fgELT_TOTALDIGITS, facetName)) {
            flags |= DatatypeValidator::FACET_TOTALDIGITS;
        }
        else if (XMLString::equals(SchemaSymbols::fgELT_FRACTIONDIGITS, facetName)) {
            flags |= DatatypeValidator::FACET_FRACTIONDIGITS;
        }
        else if ((XMLString::equals(SchemaSymbols::fgELT_WHITESPACE, facetName)) &&
                 baseDV->getType() == DatatypeValidator::String) {
            flags |= DatatypeValidator::FACET_WHITESPACE;
        }
    }
}